

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_525a::ktxStreamTest_CanCreateKtx2FromCppStream_Test::TestBody
          (ktxStreamTest_CanCreateKtx2FromCppStream_Test *this)

{
  char *pcVar1;
  size_t sVar2;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr_2;
  ostream *poVar3;
  KtxTexture<ktxTexture2> texture2;
  ktx_error_code_e err;
  StreambufStream ktx2Stream;
  AssertHelper local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  AssertHelper local_50;
  KtxTexture<ktxTexture2> local_48;
  ktx_error_code_e local_3c;
  StreambufStream local_38;
  
  StreambufStream::StreambufStream(&local_38,&(this->super_ktxStreamTest)._ktx2Streambuf,_S_in);
  local_48._handle = (ktxTexture2 *)0x0;
  local_3c = ktxTexture2_CreateFromStream
                       (local_38._stream._M_t.
                        super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                        super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                        super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1);
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_80._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_70,"err","KTX_SUCCESS",&local_3c,(ktx_error_code_e *)&local_80);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_80._M_head_impl + 0x10),"Failed to create KTX2 from C++ stream: ",
               0x27);
    pcVar1 = (char *)ktxErrorString(local_3c);
    poVar3 = (ostream *)(local_80._M_head_impl + 0x10);
    if (pcVar1 == (char *)0x0) {
      sVar2 = 6;
      pcVar1 = "(null)";
    }
    else {
      sVar2 = strlen(pcVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x162,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<(anonymous_namespace)::KtxTexture<ktxTexture2>,decltype(nullptr)>
            (local_70,"texture2",&local_48,&local_80._M_head_impl);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_80._M_head_impl + 0x10),"Newly-created KTX2 is null",0x1a);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x163,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010aff6;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_68;
  }
  else {
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_80._M_head_impl._0_1_ = local_38._destructed;
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_38._destructed != false) goto LAB_0010aff6;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_78;
    testing::Message::Message((Message *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_88.data_)->line,
               "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)",0x3f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_80,(AssertionResult *)"ktx2Stream.destructed()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x164,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
    }
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
    local_68 = local_78;
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010aff6;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_68);
LAB_0010aff6:
  if (local_48._handle != (ktxTexture2 *)0x0) {
    (*(code *)**(undefined8 **)(local_48._handle + 8))();
  }
  StreambufStream::~StreambufStream(&local_38);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanCreateKtx2FromCppStream)
{
    StreambufStream ktx2Stream{std::move(_ktx2Streambuf), std::ios::in};
    KtxTexture<ktxTexture2> texture2;

    KTX_error_code err = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture2.pHandle());
    EXPECT_EQ(err, KTX_SUCCESS) << "Failed to create KTX2 from C++ stream: " << ktxErrorString(err);
    ASSERT_NE(texture2, nullptr) << "Newly-created KTX2 is null";
    EXPECT_TRUE(ktx2Stream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
}